

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.cpp
# Opt level: O0

int qt_gl_resolve_features(void)

{
  bool bVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  Int IVar7;
  OpenGLContextProfile OVar8;
  long in_FS_OFFSET;
  int features;
  QOpenGLContext *ctx;
  pair<int,_int> version;
  QSurfaceFormat format;
  QOpenGLExtensionMatcher extensions;
  undefined4 in_stack_fffffffffffffcd8;
  FormatOption in_stack_fffffffffffffcdc;
  enum_type in_stack_fffffffffffffce0;
  enum_type in_stack_fffffffffffffce4;
  undefined1 in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffce9;
  undefined1 in_stack_fffffffffffffcea;
  byte bVar9;
  undefined1 in_stack_fffffffffffffceb;
  undefined1 in_stack_fffffffffffffcec;
  undefined1 in_stack_fffffffffffffced;
  undefined1 in_stack_fffffffffffffcee;
  undefined1 in_stack_fffffffffffffcef;
  bool local_30b;
  bool local_309;
  bool local_300;
  bool local_2fc;
  bool local_2fb;
  uint local_2ec;
  int local_2d8 [2];
  pair<int,_int> local_2d0;
  Data *in_stack_fffffffffffffd38;
  int local_2ac [2];
  pair<int,_int> local_2a4;
  int local_29c [2];
  pair<int,_int> local_294;
  int local_28c [2];
  pair<int,_int> local_284;
  pair<int,_int> local_27c;
  QFlagsStorageHelper<QOpenGLFunctions::OpenGLFeature,_4> local_274;
  QByteArray local_270;
  QByteArray local_258;
  QByteArray local_240;
  QByteArray local_228;
  QByteArray local_210;
  QByteArray local_1f8;
  QByteArray local_1e0;
  QByteArray local_1c8;
  QByteArray local_1b0;
  QFlagsStorageHelper<QOpenGLFunctions::OpenGLFeature,_4> local_194;
  QFlagsStorageHelper<QOpenGLFunctions::OpenGLFeature,_4> local_190;
  QFlagsStorageHelper<QOpenGLFunctions::OpenGLFeature,_4> local_18c;
  QFlagsStorageHelper<QOpenGLFunctions::OpenGLFeature,_4> local_188;
  QFlagsStorageHelper<QOpenGLFunctions::OpenGLFeature,_4> local_184;
  QFlagsStorageHelper<QOpenGLFunctions::OpenGLFeature,_4> local_180;
  QFlagsStorageHelper<QOpenGLFunctions::OpenGLFeature,_4> local_17c;
  QFlagsStorageHelper<QOpenGLFunctions::OpenGLFeature,_4> local_178;
  QFlagsStorageHelper<QOpenGLFunctions::OpenGLFeature,_4> local_174;
  QFlagsStorageHelper<QOpenGLFunctions::OpenGLFeature,_4> local_170;
  QFlagsStorageHelper<QOpenGLFunctions::OpenGLFeature,_4> local_16c;
  QFlagsStorageHelper<QOpenGLFunctions::OpenGLFeature,_4> local_168;
  QFlagsStorageHelper<QOpenGLFunctions::OpenGLFeature,_4> local_164;
  QByteArray local_160;
  QByteArray local_148;
  QFlagsStorageHelper<QOpenGLFunctions::OpenGLFeature,_4> local_12c;
  QSurfaceFormat local_128;
  QByteArray local_120;
  QSurfaceFormat local_108;
  QSurfaceFormat local_100;
  QByteArray local_f8;
  QSurfaceFormat local_e0;
  QFlagsStorageHelper<QOpenGLFunctions::OpenGLFeature,_4> local_d4;
  QByteArray local_d0;
  QByteArray local_b8;
  QFlagsStorageHelper<QOpenGLFunctions::OpenGLFeature,_4> local_9c;
  QFlagsStorageHelper<QOpenGLFunctions::OpenGLFeature,_4> local_98;
  QFlagsStorageHelper<QOpenGLFunctions::OpenGLFeature,_4> local_94;
  QFlagsStorageHelper<QOpenGLFunctions::OpenGLFeature,_4> local_90;
  QFlagsStorageHelper<QOpenGLFunctions::OpenGLFeature,_4> local_8c;
  QFlagsStorageHelper<QOpenGLFunctions::OpenGLFeature,_4> local_88;
  QFlagsStorageHelper<QOpenGLFunctions::OpenGLFeature,_4> local_84;
  QFlagsStorageHelper<QOpenGLFunctions::OpenGLFeature,_4> local_80;
  QFlagsStorageHelper<QOpenGLFunctions::OpenGLFeature,_4> local_7c;
  QFlagsStorageHelper<QOpenGLFunctions::OpenGLFeature,_4> local_78;
  QFlagsStorageHelper<QOpenGLFunctions::OpenGLFeature,_4> local_74;
  QByteArray local_70;
  QByteArray local_58;
  QByteArray local_40;
  QByteArray local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QOpenGLContext::currentContext();
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QOpenGLExtensionMatcher::QOpenGLExtensionMatcher
            ((QOpenGLExtensionMatcher *)in_stack_fffffffffffffd38);
  local_2ec = 0;
  QByteArray::QByteArray(&local_28,"GL_KHR_blend_equation_advanced",-1);
  bVar3 = QOpenGLExtensionMatcher::match
                    ((QOpenGLExtensionMatcher *)
                     CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                     (QByteArray *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  bVar1 = false;
  bVar5 = false;
  bVar4 = false;
  if (bVar3) {
LAB_0090c570:
    QByteArray::QByteArray(&local_58,"GL_KHR_blend_equation_advanced_coherent",-1);
    bVar5 = true;
    bVar4 = QOpenGLExtensionMatcher::match
                      ((QOpenGLExtensionMatcher *)
                       CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                       (QByteArray *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    local_2fc = true;
    bVar4 = !bVar4;
    if (bVar4) {
      QByteArray::QByteArray(&local_70,"GL_NV_blend_equation_advanced_coherent",-1);
      local_2fc = QOpenGLExtensionMatcher::match
                            ((QOpenGLExtensionMatcher *)
                             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                             (QByteArray *)
                             CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    }
    local_2fb = local_2fc;
  }
  else {
    QByteArray::QByteArray(&local_40,"GL_NV_blend_equation_advanced",-1);
    bVar1 = true;
    bVar3 = QOpenGLExtensionMatcher::match
                      ((QOpenGLExtensionMatcher *)
                       CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                       (QByteArray *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    local_2fb = false;
    if (bVar3) goto LAB_0090c570;
  }
  if (bVar4) {
    QByteArray::~QByteArray((QByteArray *)0x90c611);
  }
  if (bVar5) {
    QByteArray::~QByteArray((QByteArray *)0x90c627);
  }
  if (bVar1) {
    QByteArray::~QByteArray((QByteArray *)0x90c63d);
  }
  QByteArray::~QByteArray((QByteArray *)0x90c64a);
  if (local_2fb != false) {
    local_2ec = 0x20000;
  }
  bVar4 = QOpenGLContext::isOpenGLES
                    ((QOpenGLContext *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0)
                    );
  if (bVar4) {
    local_9c.super_QFlagsStorage<QOpenGLFunctions::OpenGLFeature>.i =
         (QFlagsStorage<QOpenGLFunctions::OpenGLFeature>)
         operator|(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0);
    local_98.super_QFlagsStorage<QOpenGLFunctions::OpenGLFeature>.i =
         (QFlagsStorage<QOpenGLFunctions::OpenGLFeature>)
         QFlags<QOpenGLFunctions::OpenGLFeature>::operator|
                   ((QFlags<QOpenGLFunctions::OpenGLFeature> *)
                    CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                    in_stack_fffffffffffffcdc);
    local_94.super_QFlagsStorage<QOpenGLFunctions::OpenGLFeature>.i =
         (QFlagsStorage<QOpenGLFunctions::OpenGLFeature>)
         QFlags<QOpenGLFunctions::OpenGLFeature>::operator|
                   ((QFlags<QOpenGLFunctions::OpenGLFeature> *)
                    CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                    in_stack_fffffffffffffcdc);
    local_90.super_QFlagsStorage<QOpenGLFunctions::OpenGLFeature>.i =
         (QFlagsStorage<QOpenGLFunctions::OpenGLFeature>)
         QFlags<QOpenGLFunctions::OpenGLFeature>::operator|
                   ((QFlags<QOpenGLFunctions::OpenGLFeature> *)
                    CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                    in_stack_fffffffffffffcdc);
    local_8c.super_QFlagsStorage<QOpenGLFunctions::OpenGLFeature>.i =
         (QFlagsStorage<QOpenGLFunctions::OpenGLFeature>)
         QFlags<QOpenGLFunctions::OpenGLFeature>::operator|
                   ((QFlags<QOpenGLFunctions::OpenGLFeature> *)
                    CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                    in_stack_fffffffffffffcdc);
    local_88.super_QFlagsStorage<QOpenGLFunctions::OpenGLFeature>.i =
         (QFlagsStorage<QOpenGLFunctions::OpenGLFeature>)
         QFlags<QOpenGLFunctions::OpenGLFeature>::operator|
                   ((QFlags<QOpenGLFunctions::OpenGLFeature> *)
                    CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                    in_stack_fffffffffffffcdc);
    local_84.super_QFlagsStorage<QOpenGLFunctions::OpenGLFeature>.i =
         (QFlagsStorage<QOpenGLFunctions::OpenGLFeature>)
         QFlags<QOpenGLFunctions::OpenGLFeature>::operator|
                   ((QFlags<QOpenGLFunctions::OpenGLFeature> *)
                    CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                    in_stack_fffffffffffffcdc);
    local_80.super_QFlagsStorage<QOpenGLFunctions::OpenGLFeature>.i =
         (QFlagsStorage<QOpenGLFunctions::OpenGLFeature>)
         QFlags<QOpenGLFunctions::OpenGLFeature>::operator|
                   ((QFlags<QOpenGLFunctions::OpenGLFeature> *)
                    CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                    in_stack_fffffffffffffcdc);
    local_7c.super_QFlagsStorage<QOpenGLFunctions::OpenGLFeature>.i =
         (QFlagsStorage<QOpenGLFunctions::OpenGLFeature>)
         QFlags<QOpenGLFunctions::OpenGLFeature>::operator|
                   ((QFlags<QOpenGLFunctions::OpenGLFeature> *)
                    CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                    in_stack_fffffffffffffcdc);
    local_78.super_QFlagsStorage<QOpenGLFunctions::OpenGLFeature>.i =
         (QFlagsStorage<QOpenGLFunctions::OpenGLFeature>)
         QFlags<QOpenGLFunctions::OpenGLFeature>::operator|
                   ((QFlags<QOpenGLFunctions::OpenGLFeature> *)
                    CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                    in_stack_fffffffffffffcdc);
    local_74.super_QFlagsStorage<QOpenGLFunctions::OpenGLFeature>.i =
         (QFlagsStorage<QOpenGLFunctions::OpenGLFeature>)
         QFlags<QOpenGLFunctions::OpenGLFeature>::operator|
                   ((QFlags<QOpenGLFunctions::OpenGLFeature> *)
                    CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                    in_stack_fffffffffffffcdc);
    IVar7 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_74);
    local_2ec = IVar7 | local_2ec;
    QByteArray::QByteArray(&local_b8,"GL_IMG_texture_npot",-1);
    bVar4 = QOpenGLExtensionMatcher::match
                      ((QOpenGLExtensionMatcher *)
                       CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                       (QByteArray *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    QByteArray::~QByteArray((QByteArray *)0x90c7da);
    if (bVar4) {
      local_2ec = local_2ec | 0x1000;
    }
    QByteArray::QByteArray(&local_d0,"GL_OES_texture_npot",-1);
    bVar4 = QOpenGLExtensionMatcher::match
                      ((QOpenGLExtensionMatcher *)
                       CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                       (QByteArray *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    QByteArray::~QByteArray((QByteArray *)0x90c832);
    if (bVar4) {
      local_d4.super_QFlagsStorage<QOpenGLFunctions::OpenGLFeature>.i =
           (QFlagsStorage<QOpenGLFunctions::OpenGLFeature>)
           operator|(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0);
      IVar7 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_d4);
      local_2ec = IVar7 | local_2ec;
    }
    QOpenGLContext::format
              ((QOpenGLContext *)
               CONCAT17(in_stack_fffffffffffffcef,
                        CONCAT16(in_stack_fffffffffffffcee,
                                 CONCAT15(in_stack_fffffffffffffced,
                                          CONCAT14(in_stack_fffffffffffffcec,
                                                   CONCAT13(in_stack_fffffffffffffceb,
                                                            CONCAT12(in_stack_fffffffffffffcea,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffce9,
                                                  in_stack_fffffffffffffce8))))))));
    iVar6 = QSurfaceFormat::majorVersion(&local_e0);
    local_300 = true;
    if (iVar6 < 3) {
      QByteArray::QByteArray(&local_f8,"GL_EXT_texture_rg",-1);
      local_300 = QOpenGLExtensionMatcher::match
                            ((QOpenGLExtensionMatcher *)
                             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                             (QByteArray *)
                             CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      QByteArray::~QByteArray((QByteArray *)0x90c8ef);
    }
    QSurfaceFormat::~QSurfaceFormat
              ((QSurfaceFormat *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    if (local_300 != false) {
      local_2ec = local_2ec | 0x8000;
    }
    QOpenGLContext::format
              ((QOpenGLContext *)
               CONCAT17(in_stack_fffffffffffffcef,
                        CONCAT16(in_stack_fffffffffffffcee,
                                 CONCAT15(in_stack_fffffffffffffced,
                                          CONCAT14(in_stack_fffffffffffffcec,
                                                   CONCAT13(in_stack_fffffffffffffceb,
                                                            CONCAT12(in_stack_fffffffffffffcea,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffce9,
                                                  in_stack_fffffffffffffce8))))))));
    iVar6 = QSurfaceFormat::majorVersion(&local_100);
    QSurfaceFormat::~QSurfaceFormat
              ((QSurfaceFormat *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    uVar2 = local_2ec;
    if (2 < iVar6) {
      QOpenGLContext::format
                ((QOpenGLContext *)
                 CONCAT17(in_stack_fffffffffffffcef,
                          CONCAT16(in_stack_fffffffffffffcee,
                                   CONCAT15(in_stack_fffffffffffffced,
                                            CONCAT14(in_stack_fffffffffffffcec,
                                                     CONCAT13(in_stack_fffffffffffffceb,
                                                              CONCAT12(in_stack_fffffffffffffcea,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffffce9,
                                                  in_stack_fffffffffffffce8))))))));
      iVar6 = QSurfaceFormat::minorVersion(&local_108);
      local_309 = false;
      if (1 < iVar6) {
        QByteArray::QByteArray(&local_120,"GL_KHR_blend_equation_advanced_coherent",-1);
        local_309 = QOpenGLExtensionMatcher::match
                              ((QOpenGLExtensionMatcher *)
                               CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                               (QByteArray *)
                               CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
        QByteArray::~QByteArray((QByteArray *)0x90c9e5);
      }
      QSurfaceFormat::~QSurfaceFormat
                ((QSurfaceFormat *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
      uVar2 = local_2ec | 0x10000;
      if (local_309 != false) {
        uVar2 = local_2ec | 0x30000;
      }
    }
    goto LAB_0090d223;
  }
  local_2ec = local_2ec | 0x8000;
  local_128.d = (QSurfaceFormatPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QOpenGLContext::currentContext();
  QOpenGLContext::format
            ((QOpenGLContext *)
             CONCAT17(in_stack_fffffffffffffcef,
                      CONCAT16(in_stack_fffffffffffffcee,
                               CONCAT15(in_stack_fffffffffffffced,
                                        CONCAT14(in_stack_fffffffffffffcec,
                                                 CONCAT13(in_stack_fffffffffffffceb,
                                                          CONCAT12(in_stack_fffffffffffffcea,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffffce9,
                                                  in_stack_fffffffffffffce8))))))));
  iVar6 = QSurfaceFormat::majorVersion(&local_128);
  if (iVar6 < 3) {
    QByteArray::QByteArray(&local_148,"GL_EXT_framebuffer_object",-1);
    bVar4 = QOpenGLExtensionMatcher::match
                      ((QOpenGLExtensionMatcher *)
                       CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                       (QByteArray *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    local_30b = true;
    if (!bVar4) {
      QByteArray::QByteArray(&local_160,"GL_ARB_framebuffer_object",-1);
      local_30b = QOpenGLExtensionMatcher::match
                            ((QOpenGLExtensionMatcher *)
                             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                             (QByteArray *)
                             CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      QByteArray::~QByteArray((QByteArray *)0x90cb2c);
    }
    QByteArray::~QByteArray((QByteArray *)0x90cb39);
    if (local_30b != false) {
      local_164.super_QFlagsStorage<QOpenGLFunctions::OpenGLFeature>.i =
           (QFlagsStorage<QOpenGLFunctions::OpenGLFeature>)
           operator|(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0);
      IVar7 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_164);
      local_2ec = IVar7 | local_2ec;
    }
  }
  else {
    local_12c.super_QFlagsStorage<QOpenGLFunctions::OpenGLFeature>.i =
         (QFlagsStorage<QOpenGLFunctions::OpenGLFeature>)
         operator|(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0);
    IVar7 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_12c);
    local_2ec = IVar7 | local_2ec;
  }
  iVar6 = QSurfaceFormat::majorVersion(&local_128);
  if (iVar6 < 2) {
    QByteArray::QByteArray(&local_1b0,"GL_ARB_multitexture",-1);
    bVar4 = QOpenGLExtensionMatcher::match
                      ((QOpenGLExtensionMatcher *)
                       CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                       (QByteArray *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    QByteArray::~QByteArray((QByteArray *)0x90cd0a);
    if (bVar4) {
      local_2ec = local_2ec | 1;
    }
    QByteArray::QByteArray(&local_1c8,"GL_ARB_shader_objects",-1);
    bVar4 = QOpenGLExtensionMatcher::match
                      ((QOpenGLExtensionMatcher *)
                       CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                       (QByteArray *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    QByteArray::~QByteArray((QByteArray *)0x90cd60);
    if (bVar4) {
      local_2ec = local_2ec | 2;
    }
    QByteArray::QByteArray(&local_1e0,"GL_EXT_blend_color",-1);
    bVar4 = QOpenGLExtensionMatcher::match
                      ((QOpenGLExtensionMatcher *)
                       CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                       (QByteArray *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    QByteArray::~QByteArray((QByteArray *)0x90cdb6);
    if (bVar4) {
      local_2ec = local_2ec | 0x10;
    }
    QByteArray::QByteArray(&local_1f8,"GL_EXT_blend_equation_separate",-1);
    bVar4 = QOpenGLExtensionMatcher::match
                      ((QOpenGLExtensionMatcher *)
                       CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                       (QByteArray *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    QByteArray::~QByteArray((QByteArray *)0x90ce0c);
    if (bVar4) {
      local_2ec = local_2ec | 0x40;
    }
    QByteArray::QByteArray(&local_210,"GL_EXT_blend_subtract",-1);
    bVar9 = QOpenGLExtensionMatcher::match
                      ((QOpenGLExtensionMatcher *)
                       CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                       (QByteArray *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    QByteArray::~QByteArray((QByteArray *)0x90ce62);
    if ((bVar9 & 1) != 0) {
      local_2ec = local_2ec | 0x100;
    }
    QByteArray::QByteArray(&local_228,"GL_EXT_blend_func_separate",-1);
    bVar9 = QOpenGLExtensionMatcher::match
                      ((QOpenGLExtensionMatcher *)
                       CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                       (QByteArray *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    QByteArray::~QByteArray((QByteArray *)0x90ceba);
    if ((bVar9 & 1) != 0) {
      local_2ec = local_2ec | 0x80;
    }
    QByteArray::QByteArray(&local_240,"GL_ARB_texture_compression",-1);
    bVar9 = QOpenGLExtensionMatcher::match
                      ((QOpenGLExtensionMatcher *)
                       CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                       (QByteArray *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    QByteArray::~QByteArray((QByteArray *)0x90cf12);
    if ((bVar9 & 1) != 0) {
      local_2ec = local_2ec | 0x200;
    }
    QByteArray::QByteArray(&local_258,"GL_ARB_multisample",-1);
    bVar9 = QOpenGLExtensionMatcher::match
                      ((QOpenGLExtensionMatcher *)
                       CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                       (QByteArray *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    QByteArray::~QByteArray((QByteArray *)0x90cf6a);
    if ((bVar9 & 1) != 0) {
      local_2ec = local_2ec | 0x400;
    }
    QByteArray::QByteArray(&local_270,"GL_ARB_texture_non_power_of_two",-1);
    bVar9 = QOpenGLExtensionMatcher::match
                      ((QOpenGLExtensionMatcher *)
                       CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                       (QByteArray *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    QByteArray::~QByteArray((QByteArray *)0x90cfc2);
    if ((bVar9 & 1) != 0) {
      local_274.super_QFlagsStorage<QOpenGLFunctions::OpenGLFeature>.i =
           (QFlagsStorage<QOpenGLFunctions::OpenGLFeature>)
           operator|(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0);
      IVar7 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_274);
      local_2ec = IVar7 | local_2ec;
    }
  }
  else {
    local_194.super_QFlagsStorage<QOpenGLFunctions::OpenGLFeature>.i =
         (QFlagsStorage<QOpenGLFunctions::OpenGLFeature>)
         operator|(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0);
    local_190.super_QFlagsStorage<QOpenGLFunctions::OpenGLFeature>.i =
         (QFlagsStorage<QOpenGLFunctions::OpenGLFeature>)
         QFlags<QOpenGLFunctions::OpenGLFeature>::operator|
                   ((QFlags<QOpenGLFunctions::OpenGLFeature> *)
                    CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                    in_stack_fffffffffffffcdc);
    local_18c.super_QFlagsStorage<QOpenGLFunctions::OpenGLFeature>.i =
         (QFlagsStorage<QOpenGLFunctions::OpenGLFeature>)
         QFlags<QOpenGLFunctions::OpenGLFeature>::operator|
                   ((QFlags<QOpenGLFunctions::OpenGLFeature> *)
                    CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                    in_stack_fffffffffffffcdc);
    local_188.super_QFlagsStorage<QOpenGLFunctions::OpenGLFeature>.i =
         (QFlagsStorage<QOpenGLFunctions::OpenGLFeature>)
         QFlags<QOpenGLFunctions::OpenGLFeature>::operator|
                   ((QFlags<QOpenGLFunctions::OpenGLFeature> *)
                    CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                    in_stack_fffffffffffffcdc);
    local_184.super_QFlagsStorage<QOpenGLFunctions::OpenGLFeature>.i =
         (QFlagsStorage<QOpenGLFunctions::OpenGLFeature>)
         QFlags<QOpenGLFunctions::OpenGLFeature>::operator|
                   ((QFlags<QOpenGLFunctions::OpenGLFeature> *)
                    CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                    in_stack_fffffffffffffcdc);
    local_180.super_QFlagsStorage<QOpenGLFunctions::OpenGLFeature>.i =
         (QFlagsStorage<QOpenGLFunctions::OpenGLFeature>)
         QFlags<QOpenGLFunctions::OpenGLFeature>::operator|
                   ((QFlags<QOpenGLFunctions::OpenGLFeature> *)
                    CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                    in_stack_fffffffffffffcdc);
    local_17c.super_QFlagsStorage<QOpenGLFunctions::OpenGLFeature>.i =
         (QFlagsStorage<QOpenGLFunctions::OpenGLFeature>)
         QFlags<QOpenGLFunctions::OpenGLFeature>::operator|
                   ((QFlags<QOpenGLFunctions::OpenGLFeature> *)
                    CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                    in_stack_fffffffffffffcdc);
    local_178.super_QFlagsStorage<QOpenGLFunctions::OpenGLFeature>.i =
         (QFlagsStorage<QOpenGLFunctions::OpenGLFeature>)
         QFlags<QOpenGLFunctions::OpenGLFeature>::operator|
                   ((QFlags<QOpenGLFunctions::OpenGLFeature> *)
                    CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                    in_stack_fffffffffffffcdc);
    local_174.super_QFlagsStorage<QOpenGLFunctions::OpenGLFeature>.i =
         (QFlagsStorage<QOpenGLFunctions::OpenGLFeature>)
         QFlags<QOpenGLFunctions::OpenGLFeature>::operator|
                   ((QFlags<QOpenGLFunctions::OpenGLFeature> *)
                    CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                    in_stack_fffffffffffffcdc);
    local_170.super_QFlagsStorage<QOpenGLFunctions::OpenGLFeature>.i =
         (QFlagsStorage<QOpenGLFunctions::OpenGLFeature>)
         QFlags<QOpenGLFunctions::OpenGLFeature>::operator|
                   ((QFlags<QOpenGLFunctions::OpenGLFeature> *)
                    CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                    in_stack_fffffffffffffcdc);
    local_16c.super_QFlagsStorage<QOpenGLFunctions::OpenGLFeature>.i =
         (QFlagsStorage<QOpenGLFunctions::OpenGLFeature>)
         QFlags<QOpenGLFunctions::OpenGLFeature>::operator|
                   ((QFlags<QOpenGLFunctions::OpenGLFeature> *)
                    CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                    in_stack_fffffffffffffcdc);
    local_168.super_QFlagsStorage<QOpenGLFunctions::OpenGLFeature>.i =
         (QFlagsStorage<QOpenGLFunctions::OpenGLFeature>)
         QFlags<QOpenGLFunctions::OpenGLFeature>::operator|
                   ((QFlags<QOpenGLFunctions::OpenGLFeature> *)
                    CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                    in_stack_fffffffffffffcdc);
    IVar7 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_168);
    local_2ec = IVar7 | local_2ec;
  }
  local_27c = (pair<int,_int>)&DAT_aaaaaaaaaaaaaaaa;
  local_27c = QSurfaceFormat::version
                        ((QSurfaceFormat *)
                         CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  local_28c[1] = 3;
  local_28c[0] = 0;
  std::pair<int,_int>::pair<int,_int,_true>(&local_284,local_28c + 1,local_28c);
  bVar5 = std::operator<(&local_27c,&local_284);
  bVar4 = false;
  bVar9 = true;
  if (!bVar5) {
    local_29c[1] = 3;
    local_29c[0] = 0;
    std::pair<int,_int>::pair<int,_int,_true>(&local_294,local_29c + 1,local_29c);
    bVar5 = std::operator==(&local_27c,&local_294);
    if (bVar5) {
      bVar5 = QSurfaceFormat::testOption
                        ((QSurfaceFormat *)
                         CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                         in_stack_fffffffffffffcdc);
      bVar9 = true;
      if (bVar5) goto LAB_0090d1d4;
    }
    local_2ac[1] = 3;
    local_2ac[0] = 1;
    std::pair<int,_int>::pair<int,_int,_true>(&local_2a4,local_2ac + 1,local_2ac);
    bVar5 = std::operator==(&local_27c,&local_2a4);
    if (bVar5) {
      QByteArray::QByteArray((QByteArray *)&stack0xfffffffffffffd38,"GL_ARB_compatibility",-1);
      bVar4 = true;
      bVar5 = QOpenGLExtensionMatcher::match
                        ((QOpenGLExtensionMatcher *)
                         CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                         (QByteArray *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)
                        );
      bVar9 = true;
      if (bVar5) goto LAB_0090d1d4;
    }
    local_2d8[1] = 3;
    local_2d8[0] = 2;
    std::pair<int,_int>::pair<int,_int,_true>(&local_2d0,local_2d8 + 1,local_2d8);
    bVar5 = std::operator>=((pair<int,_int> *)
                            CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                            (pair<int,_int> *)
                            CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    bVar9 = false;
    if (bVar5) {
      OVar8 = QSurfaceFormat::profile(&local_128);
      bVar9 = OVar8 == CompatibilityProfile;
    }
  }
LAB_0090d1d4:
  if (bVar4) {
    QByteArray::~QByteArray((QByteArray *)0x90d1ef);
  }
  if ((bVar9 & 1) != 0) {
    local_2ec = local_2ec | 0x4000;
  }
  QSurfaceFormat::~QSurfaceFormat
            ((QSurfaceFormat *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  uVar2 = local_2ec;
LAB_0090d223:
  local_2ec = uVar2;
  QOpenGLExtensionMatcher::~QOpenGLExtensionMatcher((QOpenGLExtensionMatcher *)0x90d230);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_2ec;
  }
  __stack_chk_fail();
}

Assistant:

static int qt_gl_resolve_features()
{
    QOpenGLContext *ctx = QOpenGLContext::currentContext();
    QOpenGLExtensionMatcher extensions;
    int features = 0;
    if ((extensions.match("GL_KHR_blend_equation_advanced")
        || extensions.match("GL_NV_blend_equation_advanced")) &&
        (extensions.match("GL_KHR_blend_equation_advanced_coherent")
        || extensions.match("GL_NV_blend_equation_advanced_coherent"))) {
        // We need both the advanced equations and the coherency for us
        // to be able to easily use the new blend equations
        features |= QOpenGLFunctions::BlendEquationAdvanced;
    }
    if (ctx->isOpenGLES()) {
        // OpenGL ES
        features |= QOpenGLFunctions::Multitexture |
            QOpenGLFunctions::Shaders |
            QOpenGLFunctions::Buffers |
            QOpenGLFunctions::Framebuffers |
            QOpenGLFunctions::BlendColor |
            QOpenGLFunctions::BlendEquation |
            QOpenGLFunctions::BlendEquationSeparate |
            QOpenGLFunctions::BlendFuncSeparate |
            QOpenGLFunctions::BlendSubtract |
            QOpenGLFunctions::CompressedTextures |
            QOpenGLFunctions::Multisample |
            QOpenGLFunctions::StencilSeparate;
        if (extensions.match("GL_IMG_texture_npot"))
            features |= QOpenGLFunctions::NPOTTextures;
        if (extensions.match("GL_OES_texture_npot"))
            features |= QOpenGLFunctions::NPOTTextures |
                QOpenGLFunctions::NPOTTextureRepeat;
        if (ctx->format().majorVersion() >= 3 || extensions.match("GL_EXT_texture_rg"))
            features |= QOpenGLFunctions::TextureRGFormats;
        if (ctx->format().majorVersion() >= 3) {
            features |= QOpenGLFunctions::MultipleRenderTargets;
            if (ctx->format().minorVersion() >= 2 && extensions.match("GL_KHR_blend_equation_advanced_coherent")) {
                // GL_KHR_blend_equation_advanced is included in OpenGL ES/3.2
                features |= QOpenGLFunctions::BlendEquationAdvanced;
            }
        }
        return features;
    } else {
        // OpenGL
        features |= QOpenGLFunctions::TextureRGFormats;
        QSurfaceFormat format = QOpenGLContext::currentContext()->format();

        if (format.majorVersion() >= 3)
            features |= QOpenGLFunctions::Framebuffers | QOpenGLFunctions::MultipleRenderTargets;
        else if (extensions.match("GL_EXT_framebuffer_object") || extensions.match("GL_ARB_framebuffer_object"))
            features |= QOpenGLFunctions::Framebuffers | QOpenGLFunctions::MultipleRenderTargets;

        if (format.majorVersion() >= 2) {
            features |= QOpenGLFunctions::BlendColor |
                QOpenGLFunctions::BlendEquation |
                QOpenGLFunctions::BlendSubtract |
                QOpenGLFunctions::Multitexture |
                QOpenGLFunctions::CompressedTextures |
                QOpenGLFunctions::Multisample |
                QOpenGLFunctions::BlendFuncSeparate |
                QOpenGLFunctions::Buffers |
                QOpenGLFunctions::Shaders |
                QOpenGLFunctions::StencilSeparate |
                QOpenGLFunctions::BlendEquationSeparate |
                QOpenGLFunctions::NPOTTextures |
                QOpenGLFunctions::NPOTTextureRepeat;
        } else {
            // Recognize features by extension name.
            if (extensions.match("GL_ARB_multitexture"))
                features |= QOpenGLFunctions::Multitexture;
            if (extensions.match("GL_ARB_shader_objects"))
                features |= QOpenGLFunctions::Shaders;
            if (extensions.match("GL_EXT_blend_color"))
                features |= QOpenGLFunctions::BlendColor;
            if (extensions.match("GL_EXT_blend_equation_separate"))
                features |= QOpenGLFunctions::BlendEquationSeparate;
            if (extensions.match("GL_EXT_blend_subtract"))
                features |= QOpenGLFunctions::BlendSubtract;
            if (extensions.match("GL_EXT_blend_func_separate"))
                features |= QOpenGLFunctions::BlendFuncSeparate;
            if (extensions.match("GL_ARB_texture_compression"))
                features |= QOpenGLFunctions::CompressedTextures;
            if (extensions.match("GL_ARB_multisample"))
                features |= QOpenGLFunctions::Multisample;
            if (extensions.match("GL_ARB_texture_non_power_of_two"))
                features |= QOpenGLFunctions::NPOTTextures |
                    QOpenGLFunctions::NPOTTextureRepeat;
        }

        const std::pair<int, int> version = format.version();
        if (version < std::pair(3, 0)
            || (version == std::pair(3, 0) && format.testOption(QSurfaceFormat::DeprecatedFunctions))
            || (version == std::pair(3, 1) && extensions.match("GL_ARB_compatibility"))
            || (version >= std::pair(3, 2) && format.profile() == QSurfaceFormat::CompatibilityProfile)) {
            features |= QOpenGLFunctions::FixedFunctionPipeline;
        }
        return features;
    }
}